

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

bool __thiscall
ON_PlaneSurface::Split
          (ON_PlaneSurface *this,int dir,double c,ON_Surface **west_or_south_side,
          ON_Surface **east_or_north_side)

{
  double x;
  undefined8 uVar1;
  bool bVar2;
  ON_PlaneSurface *this_00;
  ON_PlaneSurface *this_01;
  ON_PlaneSurface *pOVar3;
  long lVar4;
  ON_Plane *pOVar5;
  ON_Plane *pOVar6;
  byte bVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double local_58;
  ON_Interval local_50;
  ON_Interval local_40;
  
  bVar7 = 0;
  if ((uint)dir < 2) {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    bVar2 = ON_Interval::Includes(&local_50,c,true);
    if (bVar2) {
      (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                (this,(ulong)(uint)dir);
      local_50.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_50.m_t[1] = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
      lVar4 = (ulong)(dir != 0) * 0x10;
      local_40.m_t[0] = *(double *)(&this->field_0xb0 + lVar4);
      local_40.m_t[1] = *(double *)((long)(&this->field_0xb0 + lVar4) + 8);
      bVar2 = ON_Interval::operator==(&local_50,&local_40);
      local_58 = c;
      if (!bVar2) {
        local_50.m_t[0] = *(double *)(&this->field_0xb0 + lVar4);
        local_50.m_t[1] = *(double *)((long)(&this->field_0xb0 + lVar4) + 8);
        (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                  (this,(ulong)(uint)dir);
        local_40.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        local_40.m_t[1] = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
        x = ON_Interval::NormalizedParameterAt(&local_40,c);
        local_58 = ON_Interval::ParameterAt(&local_50,x);
        local_50.m_t[0] = *(double *)(&this->field_0xb0 + lVar4);
        local_50.m_t[1] = *(double *)((long)(&this->field_0xb0 + lVar4) + 8);
        bVar2 = ON_Interval::Includes(&local_50,local_58,true);
        if (!bVar2) goto LAB_005730cf;
      }
      this_00 = (ON_PlaneSurface *)*west_or_south_side;
      if (this_00 == (ON_PlaneSurface *)0x0) {
        this_00 = (ON_PlaneSurface *)0x0;
      }
      else {
        if (this_00 == (ON_PlaneSurface *)*east_or_north_side) goto LAB_005730cf;
        bVar2 = ON_Object::IsKindOf((ON_Object *)this_00,&m_ON_PlaneSurface_class_rtti);
        pOVar3 = (ON_PlaneSurface *)0x0;
        if (!bVar2) {
          this_00 = pOVar3;
        }
        if (this_00 == (ON_PlaneSurface *)0x0) goto LAB_005730d1;
      }
      this_01 = (ON_PlaneSurface *)*east_or_north_side;
      if (this_01 == (ON_PlaneSurface *)0x0) {
        this_01 = (ON_PlaneSurface *)0x0;
      }
      else {
        bVar2 = ON_Object::IsKindOf((ON_Object *)this_01,&m_ON_PlaneSurface_class_rtti);
        pOVar3 = (ON_PlaneSurface *)0x0;
        if (!bVar2) {
          this_01 = pOVar3;
        }
        if (this_01 == (ON_PlaneSurface *)0x0) goto LAB_005730d1;
      }
      if (this_00 == (ON_PlaneSurface *)0x0) {
        this_00 = (ON_PlaneSurface *)operator_new(0xd0);
        ON_PlaneSurface(this_00);
      }
      if (this_01 == (ON_PlaneSurface *)0x0) {
        this_01 = (ON_PlaneSurface *)operator_new(0xd0);
        ON_PlaneSurface(this_01);
      }
      if (this_00 != this) {
        ON_Surface::operator=(&this_00->super_ON_Surface,&this->super_ON_Surface);
        pOVar5 = &this->m_plane;
        pOVar6 = &this_00->m_plane;
        for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pOVar6->origin).x = (pOVar5->origin).x;
          pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar7 * -0x10 + 8);
          pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar7 * -0x10 + 8);
        }
        uVar1 = *(undefined8 *)&this->field_0x98;
        *(undefined8 *)&this_00->field_0x90 = *(undefined8 *)&this->field_0x90;
        *(undefined8 *)&this_00->field_0x98 = uVar1;
        uVar1 = *(undefined8 *)&this->field_0xa8;
        *(undefined8 *)&this_00->field_0xa0 = *(undefined8 *)&this->field_0xa0;
        *(undefined8 *)&this_00->field_0xa8 = uVar1;
        uVar1 = *(undefined8 *)&this->field_0xb8;
        *(undefined8 *)&this_00->field_0xb0 = *(undefined8 *)&this->field_0xb0;
        *(undefined8 *)&this_00->field_0xb8 = uVar1;
        uVar1 = *(undefined8 *)&this->field_0xc8;
        *(undefined8 *)&this_00->field_0xc0 = *(undefined8 *)&this->field_0xc0;
        *(undefined8 *)&this_00->field_0xc8 = uVar1;
      }
      if (this_01 != this) {
        ON_Surface::operator=(&this_01->super_ON_Surface,&this->super_ON_Surface);
        pOVar5 = &this->m_plane;
        pOVar6 = &this_01->m_plane;
        for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pOVar6->origin).x = (pOVar5->origin).x;
          pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar7 * -0x10 + 8);
          pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar7 * -0x10 + 8);
        }
        uVar1 = *(undefined8 *)&this->field_0x98;
        *(undefined8 *)&this_01->field_0x90 = *(undefined8 *)&this->field_0x90;
        *(undefined8 *)&this_01->field_0x98 = uVar1;
        uVar1 = *(undefined8 *)&this->field_0xa8;
        *(undefined8 *)&this_01->field_0xa0 = *(undefined8 *)&this->field_0xa0;
        *(undefined8 *)&this_01->field_0xa8 = uVar1;
        uVar1 = *(undefined8 *)&this->field_0xb8;
        *(undefined8 *)&this_01->field_0xb0 = *(undefined8 *)&this->field_0xb0;
        *(undefined8 *)&this_01->field_0xb8 = uVar1;
        uVar1 = *(undefined8 *)&this->field_0xc8;
        *(undefined8 *)&this_01->field_0xc0 = *(undefined8 *)&this->field_0xc0;
        *(undefined8 *)&this_01->field_0xc8 = uVar1;
      }
      lVar4 = (ulong)(uint)dir * 0x10;
      *(double *)(&this_00->field_0x98 + lVar4) = c;
      *(double *)(&this_01->field_0x90 + lVar4) = c;
      *(double *)(&this_00->field_0xb8 + lVar4) = local_58;
      *(double *)(&this_01->field_0xb0 + lVar4) = local_58;
      *west_or_south_side = &this_00->super_ON_Surface;
      *east_or_north_side = &this_01->super_ON_Surface;
      pOVar3 = (ON_PlaneSurface *)0x1;
      goto LAB_005730d1;
    }
  }
LAB_005730cf:
  pOVar3 = (ON_PlaneSurface *)0x0;
LAB_005730d1:
  return SUB81(pOVar3,0);
}

Assistant:

bool ON_PlaneSurface::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  ON_PlaneSurface* ws_side = 0;
  ON_PlaneSurface* en_side = 0;

  if ( dir < 0 || dir > 1 )
    return false;
  if ( !Domain(dir).Includes(c,true) )
    return false;

  double t;
  if ( Domain(dir) == Extents(dir) )
    t = c;
  else
  {
    t = Extents(dir).ParameterAt( Domain(dir).NormalizedParameterAt(c) );
    if ( !Extents(dir).Includes(t,true) )
      return false;
  }

  if ( west_or_south_side )
  {
    if ( west_or_south_side == east_or_north_side )
      return false;
    ws_side = ON_PlaneSurface::Cast(west_or_south_side);
    if ( !ws_side )
      return false;
  }

  if ( east_or_north_side )
  {
    en_side = ON_PlaneSurface::Cast(east_or_north_side);
    if ( !en_side )
      return false;
  }

  if ( !ws_side )
    ws_side = new ON_PlaneSurface();
  if ( !en_side )
    en_side = new ON_PlaneSurface();

  *ws_side = *this;
  *en_side = *this;
  ws_side->m_domain[dir].m_t[1] = c;
  en_side->m_domain[dir].m_t[0] = c;
  ws_side->m_extents[dir].m_t[1] = t;
  en_side->m_extents[dir].m_t[0] = t;

  west_or_south_side = ws_side;
  east_or_north_side = en_side;

  return true;
}